

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O0

void test_bitmap_of_64(void **param_1)

{
  initializer_list<unsigned_long> l;
  initializer_list<unsigned_long> l_00;
  initializer_list<unsigned_long> l_01;
  initializer_list<unsigned_long> l_02;
  char *pcVar1;
  Roaring64Map r3a;
  Roaring64Map r1d;
  Roaring64Map r2;
  Roaring64Map r1;
  int in_stack_fffffffffffffe4c;
  Roaring64Map *this;
  char *in_stack_fffffffffffffe58;
  unsigned_long in_stack_fffffffffffffe60;
  unsigned_long result;
  Roaring64Map *in_stack_fffffffffffffe70;
  iterator in_stack_fffffffffffffe78;
  iterator in_stack_fffffffffffffe80;
  size_type in_stack_fffffffffffffe88;
  Roaring64Map *in_stack_fffffffffffffe90;
  Roaring64Map *this_00;
  Roaring64Map *in_stack_fffffffffffffe98;
  Roaring64Map *this_01;
  undefined1 *puVar2;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 *local_f8;
  undefined8 local_f0;
  undefined1 local_b0 [24];
  char local_68 [24];
  char *local_50;
  undefined8 local_48;
  Roaring64Map local_40;
  
  local_68[0] = '\x01';
  local_68[1] = '\0';
  local_68[2] = '\0';
  local_68[3] = '\0';
  local_68[4] = '\0';
  local_68[5] = '\0';
  local_68[6] = '\0';
  local_68[7] = '\0';
  local_68[8] = '\x02';
  local_68[9] = '\0';
  local_68[10] = '\0';
  local_68[0xb] = '\0';
  local_68[0xc] = '\0';
  local_68[0xd] = '\0';
  local_68[0xe] = '\0';
  local_68[0xf] = '\0';
  local_68[0x10] = '\x04';
  local_68[0x11] = '\0';
  local_68[0x12] = '\0';
  local_68[0x13] = '\0';
  local_68[0x14] = '\0';
  local_68[0x15] = '\0';
  local_68[0x16] = '\0';
  local_68[0x17] = '\0';
  pcVar1 = local_68;
  local_48 = 3;
  this = &local_40;
  l_00._M_len = in_stack_fffffffffffffe88;
  l_00._M_array = in_stack_fffffffffffffe80;
  local_50 = pcVar1;
  roaring::Roaring64Map::bitmapOfList(l_00);
  roaring::Roaring64Map::printf(this,pcVar1);
  pcVar1 = (char *)0x3;
  roaring::Roaring64Map::bitmapOf((size_t)local_b0,3,1,2,4);
  roaring::Roaring64Map::printf((Roaring64Map *)local_b0,pcVar1);
  roaring::Roaring64Map::operator==(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  _assert_true(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,(char *)this,
               in_stack_fffffffffffffe4c);
  local_118 = 1;
  uStack_110 = 2;
  local_108 = 4;
  local_f8 = &local_118;
  local_f0 = 3;
  l._M_len = (size_type)in_stack_fffffffffffffe80;
  l._M_array = in_stack_fffffffffffffe78;
  roaring::Roaring64Map::Roaring64Map(in_stack_fffffffffffffe70,l);
  roaring::Roaring64Map::operator==(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  _assert_true(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,(char *)this,
               in_stack_fffffffffffffe4c);
  this_00 = (Roaring64Map *)0x8;
  this_01 = (Roaring64Map *)0x9;
  puVar2 = &stack0xfffffffffffffe88;
  l_01._M_len = 7;
  l_01._M_array = in_stack_fffffffffffffe80;
  roaring::Roaring64Map::bitmapOfList(l_01);
  pcVar1 = (char *)0x1;
  result = 2;
  l_02._M_len = (size_type)puVar2;
  l_02._M_array = (iterator)this_01;
  roaring::Roaring64Map::operator=(this_00,l_02);
  roaring::Roaring64Map::operator==(this_01,this_00);
  _assert_true(result,pcVar1,(char *)this,in_stack_fffffffffffffe4c);
  roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x10827e);
  roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x10828b);
  roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x108298);
  roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x1082a5);
  return;
}

Assistant:

DEFINE_TEST(test_bitmap_of_64) {
    Roaring64Map r1 = Roaring64Map::bitmapOfList({1, 2, 4});
    r1.printf();
    Roaring64Map r2 =
        Roaring64Map::bitmapOf(3, uint64_t(1), uint64_t(2), uint64_t(4));
    r2.printf();
    assert_true(r1 == r2);

    Roaring64Map r1d = {1, 2, 4};
    assert_true(r1 == r1d);

    Roaring64Map r3a = Roaring64Map::bitmapOfList({7, 8, 9});
    r3a = {1, 2, 4};  // overwrite with assignment operator
    assert_true(r1 == r3a);
}